

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void addtobill(obj *obj,boolean ininv,boolean dummy,boolean silent)

{
  int iVar1;
  monst *mtmp;
  bill_x *pbVar2;
  long lVar3;
  long amount;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long quan;
  char buf [256];
  boolean container;
  long gltmp;
  long cltmp;
  long ltmp;
  char roomno;
  monst *shkp;
  boolean silent_local;
  boolean dummy_local;
  boolean ininv_local;
  obj *obj_local;
  
  cltmp = 0;
  buf[0xff] = obj->cobj != (obj *)0x0;
  if ((((u.ushops[0] != '\0') && (mtmp = shop_keeper(level,u.ushops[0]), mtmp != (monst *)0x0)) &&
      (iVar1 = inhishop(mtmp), iVar1 != 0)) &&
     ((pbVar2 = onbill(obj,mtmp,'\0'), pbVar2 == (bill_x *)0x0 &&
      ((obj->oclass != '\a' || (obj->oeaten == 0)))))) {
    if (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200) {
      pline("You got that for free!");
    }
    else if (obj->oclass == '\f') {
      costly_gold(obj->ox,obj->oy,(long)obj->quan);
    }
    else {
      if ((*(uint *)&obj->field_0x4a >> 3 & 1) == 0) {
        cltmp = get_cost(obj,mtmp);
      }
      if (((*(uint *)&obj->field_0x4a >> 3 & 1) == 0) || (buf[0xff] != '\0')) {
        if (buf[0xff] == '\0') {
          add_one_tobill(obj,dummy);
        }
        else if (obj->cobj == (obj *)0x0) {
          if ((*(uint *)&obj->field_0x4a >> 3 & 1) != 0) {
            *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
            return;
          }
          add_one_tobill(obj,dummy);
        }
        else {
          lVar3 = contained_cost(obj,mtmp,0,'\0','\0');
          amount = contained_gold(obj);
          if (cltmp != 0) {
            add_one_tobill(obj,dummy);
          }
          if (lVar3 != 0) {
            bill_box_content(obj,dummy);
          }
          picked_container(obj);
          cltmp = lVar3 + cltmp;
          if ((amount != 0) && (costly_gold(obj->ox,obj->oy,amount), cltmp == 0)) {
            return;
          }
          if ((*(uint *)&obj->field_0x4a >> 3 & 1) != 0) {
            *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
          }
        }
        if ((((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) ||
            ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0)) || (silent != '\0')) {
          if (silent == '\0') {
            if (cltmp == 0) {
              pcVar4 = Monnam(mtmp);
              pline("%s does not notice.",pcVar4);
            }
            else {
              pcVar4 = xname(obj);
              pcVar4 = the(pcVar4);
              pcVar5 = currency(cltmp);
              pcVar6 = "";
              if (1 < obj->quan) {
                pcVar6 = " each";
              }
              pline("The list price of %s is %ld %s%s.",pcVar4,cltmp,pcVar5,pcVar6);
            }
          }
        }
        else if (cltmp == 0) {
          pcVar4 = Monnam(mtmp);
          pcVar5 = xname(obj);
          pcVar5 = the(pcVar5);
          pline("%s has no interest in %s.",pcVar4,pcVar5);
        }
        else {
          strcpy((char *)&quan,"\"For you, ");
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
            strcat((char *)&quan,"scum");
          }
          else {
            append_honorific((char *)&quan);
          }
          if (ininv == '\0') {
            pcVar4 = xname(obj);
            pcVar4 = The(pcVar4);
            pcVar5 = currency(cltmp);
            pcVar6 = "";
            if (1 < obj->quan) {
              pcVar6 = " each";
            }
            pline("%s will cost you %ld %s%s.",pcVar4,cltmp,pcVar5,pcVar6);
          }
          else {
            iVar1 = obj->quan;
            obj->quan = 1;
            pcVar4 = "for this";
            if (1 < iVar1) {
              pcVar4 = "per";
            }
            pcVar5 = xname(obj);
            pline("%s; only %ld %s %s.\"",&quan,cltmp,pcVar4,pcVar5);
            obj->quan = iVar1;
          }
        }
      }
      else {
        *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
      }
    }
  }
  return;
}

Assistant:

void addtobill(struct obj *obj, boolean ininv, boolean dummy, boolean silent)
{
	struct monst *shkp;
	char roomno = *u.ushops;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L;
	boolean container = Has_contents(obj);

	if (!*u.ushops) return;

	if (!(shkp = shop_keeper(level, roomno))) return;

	if (!inhishop(shkp)) return;

	if (/* perhaps we threw it away earlier */
		 onbill(obj, shkp, FALSE) ||
		 (obj->oclass == FOOD_CLASS && obj->oeaten)
	      ) return;

	if (ESHK(shkp)->billct == BILLSZ) {
		pline("You got that for free!");
		return;
	}

	if (obj->oclass == COIN_CLASS) {
		costly_gold(obj->ox, obj->oy, obj->quan);
		return;
	}

	if (!obj->no_charge)
	    ltmp = get_cost(obj, shkp);

	if (obj->no_charge && !container) {
		obj->no_charge = 0;
		return;
	}

	if (container) {
	    if (obj->cobj == NULL) {
		if (obj->no_charge) {
		    obj->no_charge = 0;
		    return;
		} else {
		    add_one_tobill(obj, dummy);
		    goto speak;
		}
	    } else {
		cltmp += contained_cost(obj, shkp, cltmp, FALSE, FALSE);
		gltmp += contained_gold(obj);
	    }

	    if (ltmp) add_one_tobill(obj, dummy);
	    if (cltmp) bill_box_content(obj, dummy);
	    picked_container(obj); /* reset contained obj->no_charge */

	    ltmp += cltmp;

	    if (gltmp) {
		costly_gold(obj->ox, obj->oy, gltmp);
		if (!ltmp) return;
	    }

	    if (obj->no_charge)
		obj->no_charge = 0;

	} else /* i.e., !container */
	    add_one_tobill(obj, dummy);
speak:
	if (shkp->mcanmove && !shkp->msleeping && !silent) {
	    char buf[BUFSZ];

	    if (!ltmp) {
		pline("%s has no interest in %s.", Monnam(shkp),
					     the(xname(obj)));
		return;
	    }
	    strcpy(buf, "\"For you, ");
	    if (ANGRY(shkp)) strcat(buf, "scum");
	    else append_honorific(buf);
	    if (ininv) {
		long quan = obj->quan;
		obj->quan = 1L; /* fool xname() into giving singular */
		pline("%s; only %ld %s %s.\"", buf, ltmp,
			(quan > 1L) ? "per" : "for this", xname(obj));
		obj->quan = quan;
	    } else
		pline("%s will cost you %ld %s%s.",
			The(xname(obj)), ltmp, currency(ltmp),
			(obj->quan > 1L) ? " each" : "");
	} else if (!silent) {
	    if (ltmp) pline("The list price of %s is %ld %s%s.",
				   the(xname(obj)), ltmp, currency(ltmp),
				   (obj->quan > 1L) ? " each" : "");
	    else pline("%s does not notice.", Monnam(shkp));
	}
}